

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeBuilder::embedLabel(CodeBuilder *this,Label *label)

{
  undefined4 uVar1;
  undefined8 *puVar2;
  long in_RSI;
  CodeBuilder *in_RDI;
  CBLabelData *node;
  size_t allocatedSize;
  char *in_stack_00000350;
  int in_stack_0000035c;
  char *in_stack_00000360;
  CBNode *node_00;
  CodeBuilder *this_00;
  Error local_6c;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  size_t in_stack_fffffffffffffff0;
  ZoneHeap *in_stack_fffffffffffffff8;
  
  if ((in_RDI->super_CodeEmitter)._lastError == 0) {
    uVar1 = *(undefined4 *)(in_RSI + 4);
    node_00 = (CBNode *)&in_RDI->_cbHeap;
    if (((ZoneHeap *)node_00)->_zone == (Zone *)0x0) {
      DebugUtils::assertionFailed(in_stack_00000360,in_stack_0000035c,in_stack_00000350);
    }
    this_00 = in_RDI;
    puVar2 = (undefined8 *)
             ZoneHeap::_alloc(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                              (size_t *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    *puVar2 = 0;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 5;
    *(undefined1 *)((long)puVar2 + 0x11) = 0;
    *(short *)((long)puVar2 + 0x12) = (short)in_RDI->_nodeFlags;
    *(uint32_t *)((long)puVar2 + 0x14) = in_RDI->_position;
    puVar2[3] = 0;
    puVar2[4] = 0;
    *(undefined4 *)(puVar2 + 5) = uVar1;
    if (puVar2 == (undefined8 *)0x0) {
      local_6c = CodeEmitter::setLastError
                           ((CodeEmitter *)0x0,(Error)((ulong)this_00 >> 0x20),(char *)node_00);
    }
    else {
      addNode(this_00,node_00);
      local_6c = 0;
    }
  }
  else {
    local_6c = (in_RDI->super_CodeEmitter)._lastError;
  }
  return local_6c;
}

Assistant:

Error CodeBuilder::embedLabel(const Label& label) {
  if (_lastError) return _lastError;

  CBLabelData* node = newNodeT<CBLabelData>(label.getId());
  if (ASMJIT_UNLIKELY(!node))
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));

  addNode(node);
  return kErrorOk;
}